

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void textui_prefs_init(void)

{
  uint8_t *puVar1;
  wchar_t *pwVar2;
  flavor *local_18;
  flavor *f;
  wchar_t i;
  
  monster_x_attr = (uint8_t *)mem_zalloc((ulong)z_info->r_max);
  monster_x_char = (wchar_t *)mem_zalloc((ulong)z_info->r_max << 2);
  kind_x_attr = (uint8_t *)mem_zalloc((ulong)z_info->k_max);
  kind_x_char = (wchar_t *)mem_zalloc((ulong)z_info->k_max << 2);
  for (f._4_4_ = 0; f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
    puVar1 = (uint8_t *)mem_zalloc(0x19);
    feat_x_attr[f._4_4_] = puVar1;
    pwVar2 = (wchar_t *)mem_zalloc(100);
    feat_x_char[f._4_4_] = pwVar2;
  }
  for (f._4_4_ = 0; f._4_4_ < 4; f._4_4_ = f._4_4_ + 1) {
    puVar1 = (uint8_t *)mem_zalloc((ulong)z_info->trap_max);
    trap_x_attr[f._4_4_] = puVar1;
    pwVar2 = (wchar_t *)mem_zalloc((ulong)z_info->trap_max << 2);
    trap_x_char[f._4_4_] = pwVar2;
  }
  for (local_18 = flavors; local_18 != (flavor *)0x0; local_18 = local_18->next) {
    if (flavor_max < local_18->fidx) {
      flavor_max = (size_t)local_18->fidx;
    }
  }
  flavor_x_attr = (uint8_t *)mem_zalloc(flavor_max + 1);
  flavor_x_char = (wchar_t *)mem_zalloc((flavor_max + 1) * 4);
  reset_visuals(false);
  return;
}

Assistant:

void textui_prefs_init(void)
{
	int i;
	struct flavor *f;

	monster_x_attr = mem_zalloc(z_info->r_max * sizeof(uint8_t));
	monster_x_char = mem_zalloc(z_info->r_max * sizeof(wchar_t));
	kind_x_attr = mem_zalloc(z_info->k_max * sizeof(uint8_t));
	kind_x_char = mem_zalloc(z_info->k_max * sizeof(wchar_t));
	for (i = 0; i < LIGHTING_MAX; i++) {
		feat_x_attr[i] = mem_zalloc(FEAT_MAX * sizeof(uint8_t));
		feat_x_char[i] = mem_zalloc(FEAT_MAX * sizeof(wchar_t));
	}
	for (i = 0; i < LIGHTING_MAX; i++) {
		trap_x_attr[i] = mem_zalloc(z_info->trap_max * sizeof(uint8_t));
		trap_x_char[i] = mem_zalloc(z_info->trap_max * sizeof(wchar_t));
	}
	for (f = flavors; f; f = f->next)
		if (flavor_max < f->fidx)
			flavor_max = f->fidx;
	flavor_x_attr = mem_zalloc((flavor_max + 1) * sizeof(uint8_t));
	flavor_x_char = mem_zalloc((flavor_max + 1) * sizeof(wchar_t));

	reset_visuals(false);
}